

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::
constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          bit,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              sit,CoordinateOrder *internalCoordinateOrder,
          View<int,_true,_std::allocator<unsigned_long>_> *out)

{
  long lVar1;
  long lVar2;
  size_t this_00;
  View<int,_true,_std::allocator<unsigned_long>_> *internalCoordinateOrder_00;
  size_t __n;
  size_t *it;
  allocator<int> local_51;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  unsigned_long *local_40;
  size_t local_38;
  size_t offset;
  View<int,_true,_std::allocator<unsigned_long>_> *out_local;
  CoordinateOrder *internalCoordinateOrder_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  sit_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  bit_local;
  
  offset = (size_t)out;
  out_local = (View<int,_true,_std::allocator<unsigned_long>_> *)internalCoordinateOrder;
  internalCoordinateOrder_local = (CoordinateOrder *)this;
  this_local = (View<int,_false,_std::allocator<unsigned_long>_> *)sit._M_current;
  sit_local = bit;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_38 = 0;
  local_40 = sit_local._M_current;
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this,sit_local,&local_38);
  this_00 = offset;
  local_48._M_current = (unsigned_long *)this_local;
  __n = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_50 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local,__n);
  it = marray_detail::Geometry<std::allocator<unsigned_long>_>::stridesBegin
                 ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  internalCoordinateOrder_00 = out_local;
  lVar2 = *(long *)this;
  lVar1 = local_38 * 4;
  std::allocator<int>::allocator(&local_51);
  View<int,true,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
            ((View<int,true,std::allocator<unsigned_long>> *)this_00,local_48,local_50,it,
             (pointer)(lVar2 + lVar1),(CoordinateOrder *)internalCoordinateOrder_00,&local_51);
  std::allocator<int>::~allocator(&local_51);
  return;
}

Assistant:

inline void
View<T, isConst, A>::constView
(
    BaseIterator bit,
    ShapeIterator sit,
    const CoordinateOrder& internalCoordinateOrder,
    View<T, true, A>& out
) const
{
    testInvariant();
    std::size_t offset = 0;
    coordinatesToOffset(bit, offset);
    out.assign(sit, sit+dimension(), 
        geometry_.stridesBegin(), 
        static_cast<const T*>(data_) + offset,
        internalCoordinateOrder);
}